

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O3

QPushButton * __thiscall
QDialogButtonBox::addButton(QDialogButtonBox *this,QString *text,ButtonRole role)

{
  QDialogButtonBoxPrivate *this_00;
  QPushButton *this_01;
  
  if ((uint)role < 9) {
    this_00 = *(QDialogButtonBoxPrivate **)(this + 8);
    this_01 = (QPushButton *)operator_new(0x28);
    QPushButton::QPushButton(this_01,text,(QWidget *)this);
    QDialogButtonBoxPrivate::addButton(this_00,(QAbstractButton *)this_01,role,DoLayout,Connect);
  }
  else {
    addButton();
    this_01 = (QPushButton *)0x0;
  }
  return this_01;
}

Assistant:

QPushButton *QDialogButtonBox::addButton(const QString &text, ButtonRole role)
{
    Q_D(QDialogButtonBox);
    if (Q_UNLIKELY(role <= InvalidRole || role >= NRoles)) {
        qWarning("QDialogButtonBox::addButton: Invalid ButtonRole, button not added");
        return nullptr;
    }
    QPushButton *button = new QPushButton(text, this);
    d->addButton(button, role);
    return button;
}